

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O2

int nni_listener_getopt(nni_listener *l,char *name,void *val,size_t *szp,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *p_Var1;
  int iVar2;
  nni_option *pnVar3;
  
  p_Var1 = (l->l_ops).l_getopt;
  if ((p_Var1 != (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) &&
     (iVar2 = (*p_Var1)(l->l_data,name,val,szp,t), iVar2 != 9)) {
    return iVar2;
  }
  for (pnVar3 = (l->l_ops).l_options;
      (pnVar3 != (nni_option *)0x0 && (pnVar3->o_name != (char *)0x0)); pnVar3 = pnVar3 + 1) {
    iVar2 = strcmp(pnVar3->o_name,name);
    if (iVar2 == 0) {
      if (pnVar3->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
        return 0x19;
      }
      iVar2 = (*pnVar3->o_get)(l->l_data,val,szp,t);
      return iVar2;
    }
  }
  iVar2 = nni_sock_getopt(l->l_sock,name,val,szp,t);
  return iVar2;
}

Assistant:

int
nni_listener_getopt(
    nni_listener *l, const char *name, void *val, size_t *szp, nni_type t)
{
	nni_option *o;

	if (l->l_ops.l_getopt != NULL) {
		int rv = l->l_ops.l_getopt(l->l_data, name, val, szp, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = l->l_ops.l_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_get == NULL) {
			return (NNG_EWRITEONLY);
		}
		return (o->o_get(l->l_data, val, szp, t));
	}

	return (nni_sock_getopt(l->l_sock, name, val, szp, t));
}